

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iremga20.c
# Opt level: O2

void device_reset_iremga20(void *info)

{
  undefined8 *puVar1;
  long lVar2;
  
  for (lVar2 = 0; lVar2 != 0x70; lVar2 = lVar2 + 0x1c) {
    puVar1 = (undefined8 *)((long)info + lVar2 + 0x55);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)info + lVar2 + 0x4c);
    *puVar1 = 0;
    puVar1[1] = 0;
  }
  *(undefined8 *)((long)info + 0x3c) = 0;
  *(undefined8 *)((long)info + 0x44) = 0;
  *(undefined8 *)((long)info + 0x2c) = 0;
  *(undefined8 *)((long)info + 0x34) = 0;
  return;
}

Assistant:

static void device_reset_iremga20(void *info)
{
	ga20_state *chip = (ga20_state *)info;
	int i;

	for( i = 0; i < 4; i++ ) {
		chip->channel[i].start = 0;
		chip->channel[i].end = 0;
		chip->channel[i].pos = 0;
		chip->channel[i].frac = 0;
		chip->channel[i].fracrate = 0;
		chip->channel[i].volume = 0;
		chip->channel[i].rate = 0;
		chip->channel[i].counter = 0;
		chip->channel[i].play = 0;
	}

	memset(chip->regs, 0x00, 0x20 * sizeof(UINT8));
}